

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O0

void verifyOrthonormal<double>(Matrix44<double> *A)

{
  Matrix44<double> *in_RDI;
  Matrix44<double> *pMVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int j;
  int i;
  Matrix44<double> prod;
  double valueEps;
  undefined4 in_stack_fffffffffffffee8;
  int iVar2;
  undefined4 in_stack_fffffffffffffeec;
  int i_00;
  Matrix44<double> *in_stack_ffffffffffffff18;
  Matrix44<double> local_90;
  double local_10;
  Matrix44<double> *local_8;
  
  local_8 = in_RDI;
  local_10 = std::numeric_limits<double>::epsilon();
  local_10 = local_10 * 100.0;
  Imath_3_2::Matrix44<double>::transposed(in_stack_ffffffffffffff18);
  Imath_3_2::Matrix44<double>::operator*
            ((Matrix44<double> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             local_8);
  i_00 = 0;
  do {
    if (3 < i_00) {
      return;
    }
    for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
      if (i_00 == iVar2) {
        pMVar1 = &local_90;
        Imath_3_2::Matrix44<double>::operator[](pMVar1,i_00);
        std::abs((int)pMVar1);
        if (2.220446049250313e-14 < extraout_XMM0_Qa) {
          __assert_fail("std::abs (prod[i][j] - 1) <= valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x30,"void verifyOrthonormal(const Imath_3_2::Matrix44<T> &) [T = double]")
          ;
        }
      }
      else {
        pMVar1 = &local_90;
        Imath_3_2::Matrix44<double>::operator[](pMVar1,i_00);
        std::abs((int)pMVar1);
        if (2.220446049250313e-14 < extraout_XMM0_Qa_00) {
          __assert_fail("std::abs (prod[i][j]) <= valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x32,"void verifyOrthonormal(const Imath_3_2::Matrix44<T> &) [T = double]")
          ;
        }
      }
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void
verifyOrthonormal (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    const T valueEps = T (100) * std::numeric_limits<T>::epsilon ();

    const IMATH_INTERNAL_NAMESPACE::Matrix44<T> prod = A * A.transposed ();
    for (int i = 0; i < 4; ++i)
    {
        for (int j = 0; j < 4; ++j)
        {
            if (i == j)
                assert (std::abs (prod[i][j] - 1) <= valueEps);
            else
                assert (std::abs (prod[i][j]) <= valueEps);
        }
    }
}